

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

Offset<reflection::Type> __thiscall
flatbuffers::Type::Serialize(Type *this,FlatBufferBuilder *builder)

{
  unsigned_short e;
  BaseType BVar1;
  uint e_00;
  size_t sVar2;
  uoffset_t uVar3;
  StructDef *pSVar4;
  uint e_01;
  size_t sVar5;
  BaseType BVar6;
  int e_02;
  char local_38;
  
  BVar1 = this->element;
  switch(BVar1) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_BOOL:
  case BASE_TYPE_CHAR:
  case BASE_TYPE_UCHAR:
    e_01 = 1;
    break;
  case BASE_TYPE_SHORT:
  case BASE_TYPE_USHORT:
    e_01 = 2;
    break;
  case BASE_TYPE_INT:
  case BASE_TYPE_UINT:
  case BASE_TYPE_FLOAT:
  case BASE_TYPE_STRING:
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_UNION:
  case BASE_TYPE_ARRAY:
    e_01 = 4;
    break;
  case BASE_TYPE_LONG:
  case BASE_TYPE_ULONG:
  case BASE_TYPE_DOUBLE:
  case BASE_TYPE_VECTOR64:
    e_01 = 8;
    break;
  case BASE_TYPE_STRUCT:
    BVar6 = this->base_type;
    e_01 = 4;
    if (BVar6 == BASE_TYPE_VECTOR) {
      sVar2 = this->struct_def->bytesize;
      sVar5 = 4;
      if (sVar2 != 0) {
        sVar5 = sVar2;
      }
      e_01 = (uint)sVar5;
      BVar6 = BASE_TYPE_VECTOR;
    }
    goto LAB_0012024c;
  default:
    goto switchD_0012022d_default;
  }
  BVar6 = this->base_type;
LAB_0012024c:
  pSVar4 = this->struct_def;
  if ((pSVar4 == (StructDef *)0x0) &&
     (pSVar4 = (StructDef *)this->enum_def, pSVar4 == (StructDef *)0x0)) {
    e_02 = -1;
  }
  else {
    e_02 = (pSVar4->super_Definition).index;
  }
  if (BVar6 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE)) {
    e = this->fixed_length;
    e_00 = *(uint *)(&DAT_0014f3a0 + (ulong)BVar6 * 4);
    FlatBufferBuilderImpl<false>::NotNested(builder);
    builder->nested = true;
    uVar3 = (builder->buf_).size_;
    FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(builder,0xe,e_01,0);
    FlatBufferBuilderImpl<false>::AddElement<unsigned_int>(builder,0xc,e_00,4);
    FlatBufferBuilderImpl<false>::AddElement<int>(builder,8,e_02,-1);
    FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(builder,10,e,0);
    local_38 = (char)BVar1;
    FlatBufferBuilderImpl<false>::AddElement<signed_char>(builder,6,local_38,'\0');
    FlatBufferBuilderImpl<false>::AddElement<signed_char>(builder,4,(char)BVar6,'\0');
    uVar3 = FlatBufferBuilderImpl<false>::EndTable(builder,uVar3);
    return (Offset<reflection::Type>)uVar3;
  }
switchD_0012022d_default:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
}

Assistant:

Offset<reflection::Type> Type::Serialize(FlatBufferBuilder *builder) const {
  size_t element_size = SizeOf(element);
  if (base_type == BASE_TYPE_VECTOR && element == BASE_TYPE_STRUCT &&
      struct_def->bytesize != 0) {
    // struct_def->bytesize==0 means struct is table
    element_size = struct_def->bytesize;
  }
  return reflection::CreateType(
      *builder, static_cast<reflection::BaseType>(base_type),
      static_cast<reflection::BaseType>(element),
      struct_def ? struct_def->index : (enum_def ? enum_def->index : -1),
      fixed_length, static_cast<uint32_t>(SizeOf(base_type)),
      static_cast<uint32_t>(element_size));
}